

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O0

double mae(double *predicted,double *actual,int N)

{
  int local_3c;
  int i;
  double t;
  double temp;
  double err;
  int N_local;
  double *actual_local;
  double *predicted_local;
  
  t = 0.0;
  for (local_3c = 0; local_3c < N; local_3c = local_3c + 1) {
    t = ABS(actual[local_3c] - predicted[local_3c]) + t;
  }
  return t / (double)N;
}

Assistant:

double mae(double *predicted, double *actual, int N) {
    double err,temp,t;
    int i;

    temp = 0.0;

    for(i = 0; i < N;++i) {
        t = fabs(actual[i] - predicted[i]);
        temp += t;
    }

    err = temp / N;

    return err;
}